

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_kGMAACluster.cpp
# Opt level: O2

void __thiscall GMAA_kGMAACluster::SaveClusterStats(GMAA_kGMAACluster *this,string *filename)

{
  ostream *poVar1;
  string sStack_238;
  ofstream fp;
  byte abStack_1f8 [480];
  
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_1f8[*(long *)(_fp + -0x18)] & 5) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "GMAA_kGMAACluster::SaveClusterStats failed to open file ");
    poVar1 = std::operator<<(poVar1,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  SoftPrintClusteringStats_abi_cxx11_(&sStack_238,this);
  poVar1 = std::operator<<((ostream *)&fp,(string *)&sStack_238);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_238);
  std::ofstream::~ofstream(&fp);
  return;
}

Assistant:

void GMAA_kGMAACluster::SaveClusterStats(string filename) const
{
    ofstream fp(filename.c_str());
    if(!fp)
        cerr << "GMAA_kGMAACluster::SaveClusterStats failed to open file "
             << filename << endl;

    fp << SoftPrintClusteringStats() << endl;
}